

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O2

int64_t __thiscall
aeron::DriverProxy::addRcvDestination
          (DriverProxy *this,int64_t subscriptionRegistrationId,string *channel)

{
  long *plVar1;
  int64_t correlationId;
  int64_t subscriptionRegistrationId_local;
  anon_class_32_4_a7d1d41a local_28;
  
  local_28.correlationId = &correlationId;
  local_28.subscriptionRegistrationId = &subscriptionRegistrationId_local;
  LOCK();
  plVar1 = (long *)(this->m_toDriverCommandBuffer->m_buffer->m_buffer +
                   this->m_toDriverCommandBuffer->m_correlationIdCounterIndex);
  correlationId = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  subscriptionRegistrationId_local = subscriptionRegistrationId;
  local_28.this = this;
  local_28.channel = channel;
  writeCommandToDriver<aeron::DriverProxy::addRcvDestination(long,std::__cxx11::string_const&)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_28);
  return correlationId;
}

Assistant:

std::int64_t addRcvDestination(std::int64_t subscriptionRegistrationId, const std::string& channel)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            DestinationMessageFlyweight addMessage(buffer, 0);

            addMessage.clientId(m_clientId);
            addMessage.registrationId(subscriptionRegistrationId);
            addMessage.correlationId(correlationId);
            addMessage.channel(channel);

            length = addMessage.length();

            return ControlProtocolEvents::ADD_RCV_DESTINATION;
        });

        return correlationId;
    }